

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O2

MppSThdGrp mpp_sthd_grp_get(char *name,RK_S32 count)

{
  char *__s;
  char *pcVar1;
  ulong uVar2;
  MppSThdImpl *thd;
  pthread_mutexattr_t attr;
  
  if ((0 < count) &&
     (__s = (char *)mpp_osal_calloc("mpp_sthd_grp_get",(long)(count * 0x88 + 0x40)),
     __s != (char *)0x0)) {
    pcVar1 = "mpp_sthd_grp";
    if (name != (char *)0x0) {
      pcVar1 = name;
    }
    snprintf(__s,0xf,"%s",pcVar1);
    *(RK_S32 *)(__s + 0x10) = count;
    thd = (MppSThdImpl *)(__s + 0x40);
    for (uVar2 = 0; (uint)count != uVar2; uVar2 = uVar2 + 1) {
      thd->name = __s;
      mpp_sthd_init(thd,(RK_S32)uVar2);
      thd = thd + 1;
    }
    pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
    pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
    pthread_mutex_init((pthread_mutex_t *)(__s + 0x18),(pthread_mutexattr_t *)&attr);
    pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
    return __s;
  }
  _mpp_log_l(2,"mpp_thread","can NOT create %d threads group\n","mpp_sthd_grp_get",
             (ulong)(uint)count);
  return (MppSThdGrp)0x0;
}

Assistant:

MppSThdGrp mpp_sthd_grp_get(const char *name, RK_S32 count)
{
    MppSThdGrpImpl *grp = NULL;

    if (count > 0) {
        RK_S32 elem_size = MPP_ALIGN(sizeof(MppSThdImpl), 8);
        RK_S32 total_size = MPP_ALIGN(sizeof(MppSThdGrpImpl), 8) + count * elem_size;

        grp = mpp_calloc_size(MppSThdGrpImpl, total_size);
        if (grp) {
            pthread_mutexattr_t attr;
            RK_S32 i;

            if (!name)
                name = "mpp_sthd_grp";

            snprintf(grp->name, THREAD_NAME_LEN - 1, "%s", name);

            grp->count = count;
            for (i = 0; i < count; i++) {
                MppSThdImpl *thd = &grp->thds[i];

                thd->name = grp->name;
                mpp_sthd_init(thd, i);
            }

            pthread_mutexattr_init(&attr);
            pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
            pthread_mutex_init(&grp->lock, &attr);
            pthread_mutexattr_destroy(&attr);
        }
    }

    if (!grp)
        mpp_err_f("can NOT create %d threads group\n", count);

    return grp;
}